

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnImport
          (BinaryReaderLogging *this,Index index,ExternalKind kind,string_view module_name,
          string_view field_name)

{
  Enum EVar1;
  char *pcVar2;
  
  WriteIndent(this);
  if ((int)kind < 5) {
    pcVar2 = *(char **)(g_kind_name + (long)(int)kind * 8);
  }
  else {
    pcVar2 = "<error_kind>";
  }
  Stream::Writef(this->stream_,"OnImport(index: %u, kind: %s, module: \"%.*s\", field: \"%.*s\")\n",
                 (ulong)index,pcVar2,module_name.size_ & 0xffffffff,module_name.data_,
                 (ulong)(uint)field_name.size_,field_name.data_);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x11])
                    (this->reader_,(ulong)index,(ulong)kind,module_name.data_,module_name.size_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnImport(Index index,
                                     ExternalKind kind,
                                     string_view module_name,
                                     string_view field_name) {
  LOGF("OnImport(index: %" PRIindex ", kind: %s, module: \"" PRIstringview
       "\", field: \"" PRIstringview "\")\n",
       index, GetKindName(kind), WABT_PRINTF_STRING_VIEW_ARG(module_name),
       WABT_PRINTF_STRING_VIEW_ARG(field_name));
  return reader_->OnImport(index, kind, module_name, field_name);
}